

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

int Ivy_ManLatchIsSelfFeed_rec(Ivy_Obj_t *pLatch,Ivy_Obj_t *pLatchRoot)

{
  uint uVar1;
  
  for (; (uVar1 = *(uint *)&pLatch->field_0x8 & 0xf, uVar1 == 7 || (uVar1 == 4));
      pLatch = (Ivy_Obj_t *)((ulong)pLatch->pFanin0 & 0xfffffffffffffffe)) {
    if (pLatch == pLatchRoot) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Ivy_ManLatchIsSelfFeed_rec( Ivy_Obj_t * pLatch, Ivy_Obj_t * pLatchRoot )
{
    if ( !Ivy_ObjIsLatch(pLatch) && !Ivy_ObjIsBuf(pLatch) )
        return 0;
    if ( pLatch == pLatchRoot )
        return 1;
    return Ivy_ManLatchIsSelfFeed_rec( Ivy_ObjFanin0(pLatch), pLatchRoot );
}